

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_unittest.cc
# Opt level: O0

void __thiscall
bssl::der::test::ByteReaderTest_ReadToEnd_Test::ByteReaderTest_ReadToEnd_Test
          (ByteReaderTest_ReadToEnd_Test *this)

{
  ByteReaderTest_ReadToEnd_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__ByteReaderTest_ReadToEnd_Test_00919510;
  return;
}

Assistant:

TEST(ByteReaderTest, ReadToEnd) {
  uint8_t out;
  ByteReader reader((Input(kInput)));
  for (uint8_t input : kInput) {
    ASSERT_TRUE(reader.ReadByte(&out));
    ASSERT_EQ(input, out);
  }
  EXPECT_FALSE(reader.ReadByte(&out));
}